

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O1

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CPrintStm *stm)

{
  IExpression *pIVar1;
  
  std::__cxx11::string::append((char *)&this->code);
  pIVar1 = (stm->expression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 != (IExpression *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  }
  std::__cxx11::string::append((char *)&this->code);
  return;
}

Assistant:

void CConvertVisitor::Visit(CPrintStm &stm) {

	this->code += "System.out.println(";
	if (stm.expression) {
		stm.expression->Accept(*this);
	}
	this->code += ");\n";

}